

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_FeaturesWithoutEditions_Test::TestBody
          (ParseEditionsTest_FeaturesWithoutEditions_Test *this)

{
  string_view text;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  MStack_28;
  
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&MStack_28,
            "1:8: Features are only valid under editions.\n4:17: Features are only valid under editions.\n"
           );
  text._M_str = 
  "\n        syntax = \"proto3\";\n        option features.field_presence = IMPLICIT;\n        message TestMessage {\n          string foo = 1 [\n            default = \"hello\",\n            features.field_presence = EXPLICIT\n          ];\n        }"
  ;
  text._M_len = 0xec;
  ParserTest::ExpectHasValidationErrors
            (&this->super_ParseEditionsTest,text,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&MStack_28);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&MStack_28);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, FeaturesWithoutEditions) {
  ExpectHasValidationErrors(
      R"schema(
        syntax = "proto3";
        option features.field_presence = IMPLICIT;
        message TestMessage {
          string foo = 1 [
            default = "hello",
            features.field_presence = EXPLICIT
          ];
        })schema",
      "1:8: Features are only valid under editions.\n"
      "4:17: Features are only valid under editions.\n");
}